

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv__platform_loop_init(uv_loop_t *loop)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = uv__epoll_create1(0x80000);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -1;
    if ((*piVar3 == 0x26) || (*piVar3 == 0x16)) {
      iVar2 = uv__epoll_create(0x100);
      if (iVar2 != -1) {
        uv__cloexec_ioctl(iVar2,1);
        iVar1 = iVar2;
      }
    }
  }
  loop->backend_fd = iVar1;
  loop->inotify_fd = -1;
  loop->inotify_watchers = (void *)0x0;
  iVar2 = 0;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar2 = -*piVar3;
  }
  return iVar2;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  int fd;

  fd = uv__epoll_create1(UV__EPOLL_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the EPOLL_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = uv__epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return -errno;

  return 0;
}